

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesDH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  char *in_RCX;
  long in_RDX;
  char *in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar10;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  undefined4 *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H55 *privat;
  size_t d_1;
  size_t base_offset_1;
  size_t d;
  size_t base_offset;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta;
  size_t score_4;
  size_t len_4;
  size_t limit_1;
  size_t distance_1;
  size_t offset_1;
  size_t score_3;
  size_t len_3;
  size_t limit;
  size_t offset;
  size_t distance;
  void *tail;
  uint32_t item;
  uint32_t *chain;
  uint32_t head;
  uint32_t slot;
  uint32_t key_1;
  uint64_t h;
  size_t i_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t cur_ix_masked_2;
  uint8_t *source;
  uint32_t *items;
  uint16_t *heads;
  uint32_t *slot_offsets;
  uint64_t hash_mask;
  uint32_t slot_mask;
  uint32_t hash_shift;
  uint32_t slot_bits;
  uint32_t bucket_bits;
  uint32_t hash_bits;
  size_t boundary;
  uint32_t source_size;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  uint64_t t_8;
  uint64_t t_7;
  uint64_t t_10;
  uint64_t t_9;
  uint64_t t_6;
  size_t score_9;
  size_t len_9;
  size_t limit_3;
  size_t distance_3;
  size_t offset_3;
  size_t score_8;
  size_t len_8;
  size_t limit_2;
  size_t offset_2;
  size_t distance_2;
  void *tail_1;
  uint32_t item_1;
  uint32_t *chain_1;
  uint32_t head_1;
  uint32_t slot_1;
  uint32_t key_3;
  uint64_t h_1;
  size_t i_3;
  size_t best_len_3;
  size_t best_score_3;
  size_t cur_ix_masked_5;
  uint8_t *source_1;
  uint32_t *items_1;
  uint16_t *heads_1;
  uint32_t *slot_offsets_1;
  uint64_t hash_mask_1;
  uint32_t slot_mask_1;
  uint32_t hash_shift_1;
  uint32_t slot_bits_1;
  uint32_t bucket_bits_1;
  uint32_t hash_bits_1;
  size_t boundary_1;
  uint32_t source_size_1;
  size_t matching_bits_9;
  uint64_t x_9;
  uint8_t *s1_orig_9;
  size_t matching_bits_8;
  uint64_t x_8;
  uint8_t *s1_orig_8;
  uint64_t t_19;
  uint64_t t_18;
  uint64_t t_21;
  uint64_t t_20;
  uint64_t t_17;
  void *v_1;
  void *v;
  size_t nbits;
  size_t offset_4;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_5;
  uint16_t bits64;
  size_t b_5;
  size_t a_5;
  size_t b_4;
  size_t a_4;
  size_t b_1;
  size_t a_1;
  size_t b;
  size_t a;
  size_t b_3;
  size_t a_3;
  size_t b_2;
  size_t a_2;
  size_t score_1;
  size_t backward;
  size_t len_1;
  size_t i;
  size_t keys [4];
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key_out;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_3;
  uint64_t t_2;
  size_t score_6;
  size_t backward_2;
  size_t len_6;
  size_t i_2;
  size_t keys_1 [4];
  size_t score_5;
  size_t len_5;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_2;
  size_t best_score_2;
  size_t min_score_1;
  size_t key_out_1;
  size_t key_2;
  int compare_char_1;
  size_t cur_ix_masked_3;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_6;
  uint64_t x_6;
  uint8_t *s1_orig_6;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  uint64_t t_12;
  uint64_t t_11;
  uint64_t t_14;
  uint64_t t_13;
  size_t score_2;
  size_t len_2;
  size_t found_ix_masked;
  size_t backward_1;
  size_t found_ix;
  uint8_t add;
  uint8_t rem;
  uint32_t code;
  size_t pos;
  size_t cur_ix_masked_1;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_5;
  uint64_t t_4;
  size_t score_7;
  size_t len_7;
  size_t found_ix_masked_1;
  size_t backward_3;
  size_t found_ix_1;
  uint8_t add_1;
  uint8_t rem_1;
  uint32_t code_1;
  size_t pos_1;
  size_t cur_ix_masked_4;
  size_t matching_bits_7;
  uint64_t x_7;
  uint8_t *s1_orig_7;
  uint64_t t_16;
  uint64_t t_15;
  size_t i_4;
  uint32_t off;
  uint32_t key_4;
  uint32_t off_1;
  uint32_t key_5;
  uint32_t off_2;
  uint32_t key_6;
  char *local_1268;
  undefined8 in_stack_ffffffffffffeda8;
  char *in_stack_ffffffffffffedb0;
  char *local_1238;
  char *local_1230;
  char *local_1220;
  char *local_1208;
  char *local_11e8;
  char *local_11d8;
  char *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_11b0;
  char *local_11a0;
  char *local_1190;
  char *local_1178;
  char *local_1170;
  char *local_1158;
  char *local_1108;
  char *local_10f8;
  char *local_10f0;
  ulong local_10e8;
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined8 local_10d8;
  int local_10cc;
  byte local_10c6;
  byte local_10c5;
  uint local_10c4;
  char *local_10c0;
  char *local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  undefined8 local_1088;
  long local_1080;
  char *local_1078;
  long local_1070;
  char *local_1068;
  char *local_1060;
  ulong local_1058;
  undefined4 *local_1050;
  long local_1048;
  char *local_1040;
  long local_1038;
  long local_1030;
  long local_1028;
  char *local_1020;
  long local_1018;
  char *local_1010;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  char *local_fd8;
  char *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  char *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  char *local_f78;
  char *local_f70;
  char *local_f68;
  char *local_f60;
  ulong local_f58;
  char *local_f50;
  char **local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  int *local_f20;
  char *local_f18;
  long local_f10;
  ulong *local_f08;
  ulong local_f00;
  char *local_ef8;
  char **local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  int *local_ec8;
  char *local_ec0;
  long local_eb8;
  ulong *local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  char *local_e98;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  uint local_e6c;
  char *local_e68;
  uint local_e5c;
  char *local_e58;
  ulong local_e50;
  uint *local_e48;
  undefined4 *local_e40;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined8 local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  ulong local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  long local_dc8;
  char *local_dc0;
  undefined8 *local_db8;
  uint local_dac;
  uint *local_da8;
  uint local_d9c;
  uint local_d98;
  uint local_d94;
  ulong local_d90;
  ulong local_d88;
  char *local_d80;
  char *local_d78;
  ulong local_d70;
  undefined8 *local_d68;
  long local_d60;
  int *local_d58;
  int *local_d50;
  ulong local_d48;
  uint local_d3c;
  int local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  char *local_d28;
  uint local_d1c;
  char **local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  int *local_cf0;
  char *local_ce8;
  long local_ce0;
  int *local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  ulong *local_cc0;
  char *local_cb8;
  ulong *local_cb0;
  ulong *local_ca8;
  char *local_ca0;
  ulong local_c98;
  ulong local_c90;
  ulong *local_c88;
  char *local_c80;
  ulong *local_c78;
  ulong *local_c70;
  char *local_c68;
  char *local_c60;
  ulong local_c58;
  char *local_c50;
  char *local_c48;
  ulong local_c40;
  ulong *local_c38;
  ulong local_c30;
  ulong *local_c28;
  ulong local_c20;
  ulong *local_c18;
  ulong local_c10;
  ulong *local_c08;
  ulong local_c00;
  ulong *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  ulong local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  long local_ba8;
  char *local_ba0;
  undefined8 *local_b98;
  uint local_b8c;
  uint *local_b88;
  uint local_b7c;
  uint local_b78;
  uint local_b74;
  ulong local_b70;
  ulong local_b68;
  char *local_b60;
  char *local_b58;
  ulong local_b50;
  undefined8 *local_b48;
  long local_b40;
  int *local_b38;
  int *local_b30;
  ulong local_b28;
  uint local_b1c;
  int local_b18;
  int local_b14;
  int local_b10;
  int local_b0c;
  char *local_b08;
  uint local_afc;
  char **local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  int *local_ad0;
  char *local_ac8;
  long local_ac0;
  int *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong *local_aa0;
  char *local_a98;
  ulong *local_a90;
  ulong *local_a88;
  char *local_a80;
  ulong local_a78;
  ulong local_a70;
  ulong *local_a68;
  char *local_a60;
  ulong *local_a58;
  ulong *local_a50;
  char *local_a48;
  char *local_a40;
  ulong local_a38;
  char *local_a30;
  char *local_a28;
  ulong local_a20;
  ulong *local_a18;
  ulong local_a10;
  ulong *local_a08;
  ulong local_a00;
  ulong *local_9f8;
  ulong local_9f0;
  ulong *local_9e8;
  ulong local_9e0;
  ulong *local_9d8;
  char *local_9d0;
  undefined8 local_9c8;
  undefined8 *local_9c0;
  undefined8 local_9b8;
  undefined8 *local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong local_990;
  ulong local_988;
  ulong local_980;
  char *local_978;
  undefined4 *local_970;
  ushort *local_968;
  ulong local_960;
  ulong local_958;
  char *local_950;
  char *local_948;
  ushort local_93c;
  ushort local_93a;
  ushort *local_938;
  uint local_92c;
  ulong local_928;
  ulong local_920;
  int local_914;
  ulong local_910;
  ushort local_902;
  long local_900;
  long local_8f8;
  int local_8ec;
  ulong local_8e8;
  ushort local_8da;
  long local_8d8;
  long local_8d0;
  int local_8c4;
  ushort local_8be;
  uint local_8bc;
  ushort local_8b6;
  ushort local_8b4;
  ushort local_8b2;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  long local_868;
  long local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 local_838;
  char **local_830;
  undefined8 local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  int *local_800;
  char *local_7f8;
  long local_7f0;
  undefined8 local_7e8;
  long local_7e0;
  char **local_7d8;
  undefined8 local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  int *local_7a8;
  char *local_7a0;
  long local_798;
  undefined8 local_790;
  long local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  long local_768;
  long local_760;
  char *local_758;
  char *local_750;
  long local_748;
  long local_740;
  char *local_738;
  char *local_730;
  long local_728;
  long local_720;
  long local_710;
  long local_700;
  long local_6f0;
  long local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  ulong local_6c0;
  ulong auStack_6b8 [4];
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  long local_660;
  ulong local_658;
  uint local_64c;
  ulong local_648;
  char *local_640;
  long local_638;
  char **local_630;
  undefined8 local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  int *local_600;
  char *local_5f8;
  long local_5f0;
  undefined8 local_5e8;
  long local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong *local_5c8;
  char *local_5c0;
  ulong *local_5b8;
  ulong *local_5b0;
  char *local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong *local_590;
  char *local_588;
  ulong *local_580;
  ulong *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  ulong local_550;
  ulong *local_548;
  ulong local_540;
  ulong *local_538;
  ulong local_530;
  ulong *local_528;
  ulong local_520;
  ulong *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  ulong local_4f0;
  ulong auStack_4e8 [5];
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  long local_488;
  ulong local_480;
  uint local_474;
  ulong local_470;
  char *local_468;
  long local_460;
  char **local_458;
  undefined8 local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  int *local_428;
  char *local_420;
  long local_418;
  undefined8 local_410;
  long local_408;
  ulong local_400;
  ulong local_3f8;
  ulong *local_3f0;
  char *local_3e8;
  ulong *local_3e0;
  ulong *local_3d8;
  char *local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong *local_3b8;
  char *local_3b0;
  ulong *local_3a8;
  ulong *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  ulong local_378;
  ulong *local_370;
  ulong local_368;
  ulong *local_360;
  ulong local_358;
  ulong *local_350;
  ulong local_348;
  ulong *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  ulong local_320;
  char *local_318;
  ulong local_310;
  undefined1 local_306;
  undefined1 local_305;
  uint local_304;
  char *local_300;
  ulong local_2f8;
  char **local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  int *local_2c0;
  char *local_2b8;
  long local_2b0;
  undefined8 local_2a8;
  uint *local_2a0;
  ulong local_298;
  ulong local_290;
  ulong *local_288;
  char *local_280;
  ulong *local_278;
  ulong *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  ulong local_250;
  ulong *local_248;
  ulong local_240;
  ulong *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ulong local_218;
  char *local_210;
  ulong local_208;
  undefined1 local_1fe;
  undefined1 local_1fd;
  uint local_1fc;
  char *local_1f8;
  ulong local_1f0;
  char **local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  int *local_1b8;
  char *local_1b0;
  long local_1a8;
  undefined8 local_1a0;
  uint *local_198;
  ulong local_190;
  ulong local_188;
  ulong *local_180;
  char *local_178;
  ulong *local_170;
  ulong *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  ulong local_148;
  ulong *local_140;
  ulong local_138;
  ulong *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  long local_100;
  long local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  long local_d8;
  long local_d0;
  uint local_c8;
  uint32_t local_c4;
  char *local_c0;
  char *local_b8;
  long local_b0;
  long local_a8;
  uint local_a0;
  uint32_t local_9c;
  char *local_98;
  char *local_90;
  long local_88;
  long local_80;
  uint local_78;
  uint32_t local_74;
  char *local_70;
  char *local_68;
  long local_60;
  long local_58;
  char *local_50;
  char *local_48;
  long local_40;
  long local_38;
  char *local_30;
  char *local_28;
  long local_20;
  long local_18;
  
  local_1038 = in_stack_00000008 + 0x50;
  local_1040 = (char *)((1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) + -0x10);
  local_1048 = *(long *)(in_R9 + 0x10);
  local_1050 = in_stack_00000020;
  local_1058 = *in_stack_00000018;
  local_1060 = in_RSI + in_RDI;
  local_878 = 8;
  local_880 = 4;
  local_1158 = in_RSI;
  if (7 < in_RDI) {
    local_888 = 8;
    local_890 = 4;
    local_1158 = in_RSI + (in_RDI - 7);
  }
  local_1068 = local_1158;
  iVar5 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar5 = 0x40;
  }
  local_1070 = (long)iVar5;
  local_1078 = in_RSI + local_1070;
  local_1080 = *(long *)(in_R9 + 0x60);
  local_1088 = 0x7e4;
  local_6f0 = in_stack_00000008 + 0x60;
  local_1030 = in_R9;
  local_1028 = in_R8;
  local_1020 = in_RCX;
  local_1018 = in_RDX;
  pcVar7 = in_RSI;
  local_858 = local_1038;
  local_710 = local_1038;
LAB_007b8f29:
  do {
    local_1010 = pcVar7;
    local_838 = 8;
    local_840 = 4;
    if (local_1060 <= local_1010 + 8) {
      *in_stack_00000018 = (ulong)(local_1060 + (local_1058 - (long)local_1010));
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_1050 >> 4) + *in_stack_00000028;
      return;
    }
    local_1090 = local_1060 + -(long)local_1010;
    local_f60 = local_1010;
    local_f68 = local_1040;
    if (local_1010 < local_1040) {
      local_1170 = local_1010;
    }
    else {
      local_1170 = local_1040;
    }
    local_1098 = local_1170;
    local_f70 = local_1010 + local_1048;
    local_f78 = local_1040;
    local_1178 = local_f70;
    if (local_1040 <= local_f70) {
      local_1178 = local_1040;
    }
    local_10a0 = local_1178;
    local_10c4 = 0;
    local_10c5 = 0;
    local_10c6 = 0;
    if (*(int *)(local_1030 + 0x270) != 0) {
      if (local_1010 == (char *)0x0) {
        local_10c5 = 0;
      }
      else {
        local_10c5 = *(byte *)(local_1018 + ((ulong)(local_1010 + -1) & (ulong)local_1020));
      }
      if (local_1010 < (char *)0x2) {
        local_10c6 = 0;
      }
      else {
        local_10c6 = *(byte *)(local_1018 + ((ulong)(local_1010 + -2) & (ulong)local_1020));
      }
      local_10c4 = (uint)*(byte *)(local_1030 + 0x275 +
                                  (long)(int)(uint)(*(byte *)(local_1028 + (ulong)local_10c5) |
                                                   *(byte *)(local_1028 + 0x100 + (ulong)local_10c6)
                                                   ));
    }
    local_10c0 = (char *)0x0;
    local_10a8 = local_10a8 & 0xffffffff00000000;
    local_10b8 = (char *)0x0;
    local_10b0 = 0x7e4;
    local_790 = *(undefined8 *)(local_1030 + 0x2b8 + (long)(int)local_10c4 * 8);
    local_7c8 = local_1178 + local_1080;
    local_7d0 = *(undefined8 *)(local_1030 + 0x48);
    local_788 = local_1038;
    local_798 = local_1018;
    local_7a0 = local_1020;
    local_7a8 = in_stack_00000010;
    local_7b0 = local_1010;
    local_7c0 = local_1170;
    local_7d8 = &local_10c0;
    local_5e0 = local_1038;
    local_5f0 = local_1018;
    local_5f8 = local_1020;
    local_600 = in_stack_00000010;
    local_608 = local_1010;
    local_618 = local_1170;
    local_638 = *(long *)(local_1038 + 8);
    local_640 = (char *)0x0;
    local_648 = (ulong)local_1010 & (ulong)local_1020;
    local_64c = (uint)*(byte *)(local_1018 + local_648);
    local_7b8 = local_1090;
    local_630 = local_7d8;
    local_628 = local_7d0;
    local_620 = local_7c8;
    local_610 = local_1090;
    local_5e8 = local_790;
    uVar3 = duckdb_brotli::HashBytesH54((uint8_t *)(local_1018 + local_648));
    local_658 = (ulong)uVar3;
    local_668 = local_630[2];
    local_670 = local_630[2];
    local_678 = local_640;
    local_680 = (char *)(long)*local_600;
    local_688 = local_608 + -(long)*local_600;
    *(undefined4 *)(local_630 + 3) = 0;
    if (local_688 < local_608) {
      local_688 = (char *)((ulong)local_5f8 & 0xffffffff & (ulong)local_688);
      if (local_64c == (byte)(local_688 + (long)local_678)[local_5f0]) {
        local_590 = (ulong *)(local_688 + local_5f0);
        local_578 = local_590;
        local_580 = (ulong *)(local_5f0 + local_648);
        local_588 = local_610;
LAB_007b94e9:
        if (local_588 < (char *)0x8) {
          while( true ) {
            bVar10 = false;
            if (local_588 != (char *)0x0) {
              bVar10 = (char)*local_578 == (char)*local_580;
            }
            if (!bVar10) break;
            local_588 = local_588 + -1;
            local_580 = (ulong *)((long)local_580 + 1);
            local_578 = (ulong *)((long)local_578 + 1);
          }
          local_570 = (char *)((long)local_578 - (long)local_590);
        }
        else {
          local_538 = local_580;
          local_540 = *local_580;
          local_548 = local_578;
          local_550 = *local_578;
          uVar6 = *local_580 ^ *local_578;
          local_598 = uVar6;
          local_580 = local_580 + 1;
          if (uVar6 == 0) break;
          iVar5 = 0;
          for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_5a0 = (long)iVar5;
          local_570 = (char *)((long)local_578 + (((ulong)(long)iVar5 >> 3) - (long)local_590));
        }
        local_690 = local_570;
        if ((char *)0x3 < local_570) {
          local_568 = local_570;
          local_698 = (char *)((long)local_570 * 0x87 + 0x78f);
          if (local_670 < local_698) {
            *local_630 = local_570;
            local_630[1] = local_680;
            local_630[2] = local_698;
            local_678 = local_690;
            local_670 = local_698;
            local_64c = (uint)(byte)local_690[local_5f0 + local_648];
          }
        }
      }
    }
    for (local_6c0 = 0; local_6c0 < 4; local_6c0 = local_6c0 + 1) {
      auStack_6b8[local_6c0] = local_658 + local_6c0 * 8 & 0xfffff;
    }
    local_660 = *(long *)((long)auStack_6b8 + ((ulong)local_608 & 0x18));
    for (local_6c0 = 0; local_6c0 < 4; local_6c0 = local_6c0 + 1) {
      uVar6 = (ulong)*(uint *)(local_638 + auStack_6b8[local_6c0] * 4);
      local_6d0 = local_608 + -uVar6;
      local_688 = (char *)((ulong)local_5f8 & 0xffffffff & uVar6);
      if ((local_64c == (byte)(local_688 + (long)local_678)[local_5f0]) &&
         (local_6d0 != (char *)0x0 && local_6d0 <= local_618)) {
        local_5c8 = (ulong *)(local_688 + local_5f0);
        local_5b0 = local_5c8;
        local_5b8 = (ulong *)(local_5f0 + local_648);
        local_5c0 = local_610;
LAB_007b9913:
        if (local_5c0 < (char *)0x8) {
          while( true ) {
            bVar10 = false;
            if (local_5c0 != (char *)0x0) {
              bVar10 = (char)*local_5b0 == (char)*local_5b8;
            }
            if (!bVar10) break;
            local_5c0 = local_5c0 + -1;
            local_5b8 = (ulong *)((long)local_5b8 + 1);
            local_5b0 = (ulong *)((long)local_5b0 + 1);
          }
          local_5a8 = (char *)((long)local_5b0 - (long)local_5c8);
        }
        else {
          local_518 = local_5b8;
          local_520 = *local_5b8;
          local_528 = local_5b0;
          local_530 = *local_5b0;
          uVar6 = *local_5b8 ^ *local_5b0;
          local_5d0 = uVar6;
          local_5b8 = local_5b8 + 1;
          if (uVar6 == 0) goto LAB_007b99e5;
          iVar5 = 0;
          for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_5d8 = (long)iVar5;
          local_5a8 = (char *)((long)local_5b0 + (((ulong)(long)iVar5 >> 3) - (long)local_5c8));
        }
        local_6c8 = local_5a8;
        if ((char *)0x3 < local_5a8) {
          local_558 = local_5a8;
          local_560 = local_6d0;
          local_510 = local_6d0;
          iVar5 = 0x1f;
          if ((uint)local_6d0 != 0) {
            for (; (uint)local_6d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          local_6d8 = (char *)(((long)local_5a8 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e));
          if (local_670 < local_6d8) {
            local_678 = local_5a8;
            *local_630 = local_5a8;
            local_64c = (uint)(byte)local_6c8[local_5f0 + local_648];
            local_670 = local_6d8;
            local_630[2] = local_6d8;
            local_630[1] = local_6d0;
          }
        }
      }
    }
    *(int *)(local_638 + local_660 * 4) = (int)local_608;
    local_2a0 = (uint *)(local_788 + 0x10);
    local_2a8 = local_790;
    local_2b0 = local_798;
    local_2b8 = local_7a0;
    local_2c0 = local_7a8;
    local_2c8 = local_7b0;
    local_2d0 = local_7b8;
    local_2d8 = local_7c0;
    local_2e0 = local_7c8;
    local_2e8 = local_7d0;
    local_2f0 = local_7d8;
    local_2f8 = (ulong)local_7b0 & (ulong)local_7a0;
    if ((((ulong)local_7b0 & 3) == 0) && ((char *)0x1f < local_7b8)) {
      for (local_300 = *(char **)(local_788 + 0x20); local_300 <= local_2c8;
          local_300 = local_300 + 4) {
        local_304 = *local_2a0 & 0x3fffffff;
        local_305 = *(undefined1 *)(local_2b0 + ((ulong)local_300 & (ulong)local_2b8));
        local_306 = *(undefined1 *)(local_2b0 + ((ulong)(local_300 + 0x20) & (ulong)local_2b8));
        local_310 = 0xffffffff;
        uVar3 = duckdb_brotli::HashRollingFunctionHROLLING_FAST
                          ((uint32_t)((ulong)in_stack_ffffffffffffedb0 >> 0x20),
                           (uint8_t)((ulong)in_stack_ffffffffffffedb0 >> 0x18),
                           (uint8_t)((ulong)in_stack_ffffffffffffedb0 >> 0x10),
                           (uint32_t)((ulong)in_stack_ffffffffffffeda8 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffeda8);
        *local_2a0 = uVar3;
        if (local_304 < 0x1000000) {
          uVar4 = *(uint *)(*(long *)(local_2a0 + 2) + (ulong)local_304 * 4);
          local_310 = (ulong)uVar4;
          *(int *)(*(long *)(local_2a0 + 2) + (ulong)local_304 * 4) = (int)local_300;
          if ((local_300 == local_2c8) && (local_310 != 0xffffffff)) {
            uVar4 = (int)local_2c8 - uVar4;
            local_318 = (char *)(ulong)uVar4;
            if (local_318 <= local_2d8) {
              local_320 = local_310 & (ulong)local_2b8;
              local_288 = (ulong *)(local_2b0 + local_320);
              local_278 = (ulong *)(local_2b0 + local_2f8);
              local_280 = local_2d0;
              local_270 = local_288;
LAB_007b9edd:
              if (local_280 < (char *)0x8) {
                while( true ) {
                  bVar10 = false;
                  if (local_280 != (char *)0x0) {
                    bVar10 = (char)*local_270 == (char)*local_278;
                  }
                  if (!bVar10) break;
                  local_280 = local_280 + -1;
                  local_278 = (ulong *)((long)local_278 + 1);
                  local_270 = (ulong *)((long)local_270 + 1);
                }
                local_268 = (char *)((long)local_270 - (long)local_288);
              }
              else {
                local_238 = local_278;
                local_240 = *local_278;
                local_248 = local_270;
                local_250 = *local_270;
                local_290 = local_240 ^ local_250;
                local_278 = local_278 + 1;
                if (local_290 == 0) goto LAB_007b9faf;
                iVar5 = 0;
                for (uVar6 = local_290; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_298 = (ulong)iVar5;
                local_268 = (char *)((long)local_270 + ((local_298 >> 3) - (long)local_288));
              }
              local_328 = local_268;
              if (((char *)0x3 < local_268) && (*local_2f0 < local_268)) {
                local_258 = local_268;
                iVar5 = 0x1f;
                if (uVar4 != 0) {
                  for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                local_330 = (char *)(((long)local_268 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e))
                ;
                local_260 = local_318;
                local_230 = local_318;
                if (local_2f0[2] < local_330) {
                  *local_2f0 = local_268;
                  local_2f0[1] = local_318;
                  local_2f0[2] = local_330;
                  *(undefined4 *)(local_2f0 + 3) = 0;
                }
              }
            }
          }
        }
      }
      *(char **)(local_2a0 + 4) = local_2c8 + 4;
    }
    local_eb0 = (ulong *)(local_1030 + 0x58);
    local_ee8 = *(char **)(local_1030 + 0x48);
    local_eb8 = local_1018;
    local_ec0 = local_1020;
    local_ec8 = in_stack_00000010;
    local_ed0 = local_1010;
    local_ed8 = local_1090;
    local_ee0 = local_10a0;
    local_ef0 = &local_10c0;
    local_ef8 = local_10a0 + *(long *)(local_1030 + 0x60);
    for (local_f00 = 0; local_f00 < *local_eb0; local_f00 = local_f00 + 1) {
      local_cd8 = (int *)local_eb0[local_f00 + 2];
      local_d08 = local_ef8 + -local_eb0[local_f00 + 0x22];
      local_ce0 = local_eb8;
      local_ce8 = local_ec0;
      local_cf0 = local_ec8;
      local_cf8 = local_ed0;
      local_d00 = local_ed8;
      local_d10 = local_ee8;
      local_d18 = local_ef0;
      local_d1c = local_cd8[2];
      local_d28 = local_d08 + -(ulong)local_d1c;
      local_d2c = local_cd8[3];
      local_d30 = local_cd8[4];
      local_d34 = local_cd8[5];
      local_d38 = 0x40 - local_d30;
      local_d3c = 0xffffffff >> (0x20 - (byte)local_d34 & 0x1f);
      local_d48 = 0xffffffffffffffff >> (0x40U - (char)local_d2c & 0x3f);
      local_d50 = local_cd8 + 6;
      local_d58 = local_d50 + (uint)(1 << ((byte)local_d34 & 0x1f));
      local_d60 = (long)local_d58 + (ulong)(uint)(1 << ((byte)local_d30 & 0x1f)) * 2;
      local_d70 = (ulong)local_ed0 & (ulong)local_ec0;
      local_d78 = local_ef0[2];
      local_d80 = *local_ef0;
      local_bf8 = (ulong *)(local_eb8 + local_d70);
      local_c00 = *local_bf8;
      local_d90 = (local_c00 & local_d48) * 0x1fe35a7bd3579bd3;
      uVar6 = local_d90 >> ((byte)local_d38 & 0x3f);
      local_d94 = (uint)uVar6;
      local_d98 = local_d94 & local_d3c;
      local_d9c = (uint)*(ushort *)((long)local_d58 + (uVar6 & 0xffffffff) * 2);
      local_da8 = (uint *)(local_d60 + (ulong)(local_d50[local_d98] + local_d9c) * 4);
      local_dac = (uint)(local_d9c == 0xffff);
      local_db8 = (undefined8 *)(local_d60 + (ulong)(uint)local_cd8[1] * 4);
      local_d68 = local_db8;
      if (*local_cd8 != -0x21431220) {
        local_d68 = (undefined8 *)*local_db8;
        local_9b8 = local_d68;
        local_9b0 = local_db8;
      }
      for (local_d88 = 0; local_d88 < 4; local_d88 = local_d88 + 1) {
        local_dc0 = (char *)(long)local_cf0[local_d88];
        if ((local_d28 < local_dc0) && (local_dc0 <= local_d08)) {
          local_dc8 = (long)local_d08 - (long)local_dc0;
          local_1190 = (char *)((ulong)local_d1c - local_dc8);
          if (local_d00 < local_1190) {
            local_1190 = local_d00;
          }
          local_dd0 = local_1190;
          local_c88 = (ulong *)((long)local_d68 + local_dc8);
          local_c78 = (ulong *)(local_ce0 + local_d70);
          local_c80 = local_1190;
          local_c70 = local_c88;
LAB_007ba72f:
          if (local_c80 < (char *)0x8) {
            while( true ) {
              bVar10 = false;
              if (local_c80 != (char *)0x0) {
                bVar10 = (char)*local_c70 == (char)*local_c78;
              }
              if (!bVar10) break;
              local_c80 = local_c80 + -1;
              local_c78 = (ulong *)((long)local_c78 + 1);
              local_c70 = (ulong *)((long)local_c70 + 1);
            }
            local_c68 = (char *)((long)local_c70 - (long)local_c88);
          }
          else {
            local_c28 = local_c78;
            local_c30 = *local_c78;
            local_c38 = local_c70;
            local_c40 = *local_c70;
            local_c90 = local_c30 ^ local_c40;
            local_c78 = local_c78 + 1;
            if (local_c90 == 0) goto LAB_007ba801;
            iVar5 = 0;
            for (uVar6 = local_c90; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
              iVar5 = iVar5 + 1;
            }
            local_c98 = (ulong)iVar5;
            local_c68 = (char *)((long)local_c70 + ((local_c98 >> 3) - (long)local_c88));
          }
          local_dd8 = local_c68;
          if ((char *)0x1 < local_c68) {
            local_c60 = local_c68;
            local_de0 = (char *)((long)local_c68 * 0x87 + 0x78f);
            if (local_d78 < local_de0) {
              if (local_d88 != 0) {
                local_c58 = local_d88;
                local_de0 = local_de0 +
                            -((long)(int)(0x1ca10 >> ((byte)local_d88 & 0xe) & 0xe) + 0x27);
              }
              if (local_d78 < local_de0) {
                local_d78 = local_de0;
                if (local_d80 < local_c68) {
                  local_d80 = local_c68;
                }
                *local_d18 = local_c68;
                *(undefined4 *)(local_d18 + 3) = 0;
                local_d18[1] = local_dc0;
                local_d18[2] = local_d78;
              }
            }
          }
        }
      }
      while (local_dac == 0) {
        local_dac = *local_da8;
        local_da8 = local_da8 + 1;
        local_de8 = (ulong)(local_dac & 0x7fffffff);
        local_dac = local_dac & 0x80000000;
        local_df0 = local_d08 + -local_de8;
        local_11a0 = (char *)(local_d1c - local_de8);
        if (local_d00 < local_11a0) {
          local_11a0 = local_d00;
        }
        local_df8 = local_11a0;
        if ((((local_df0 <= local_d10) && (local_d80 + local_d70 <= local_ce8)) &&
            (local_d80 < local_11a0)) &&
           (local_d80[local_ce0 + local_d70] ==
            *(char *)((long)local_d68 + (long)(local_d80 + local_de8)))) {
          local_cc0 = (ulong *)((long)local_d68 + local_de8);
          local_cb0 = (ulong *)(local_ce0 + local_d70);
          local_cb8 = local_11a0;
          local_ca8 = local_cc0;
LAB_007babd1:
          if (local_cb8 < (char *)0x8) {
            while( true ) {
              bVar10 = false;
              if (local_cb8 != (char *)0x0) {
                bVar10 = (char)*local_ca8 == (char)*local_cb0;
              }
              if (!bVar10) break;
              local_cb8 = local_cb8 + -1;
              local_cb0 = (ulong *)((long)local_cb0 + 1);
              local_ca8 = (ulong *)((long)local_ca8 + 1);
            }
            local_ca0 = (char *)((long)local_ca8 - (long)local_cc0);
          }
          else {
            local_c08 = local_cb0;
            local_c10 = *local_cb0;
            local_c18 = local_ca8;
            local_c20 = *local_ca8;
            local_cc8 = local_c10 ^ local_c20;
            local_cb0 = local_cb0 + 1;
            if (local_cc8 == 0) goto LAB_007baca3;
            iVar5 = 0;
            for (uVar6 = local_cc8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
              iVar5 = iVar5 + 1;
            }
            local_cd0 = (ulong)iVar5;
            local_ca0 = (char *)((long)local_ca8 + ((local_cd0 >> 3) - (long)local_cc0));
          }
          local_e00 = local_ca0;
          if ((char *)0x3 < local_ca0) {
            local_c48 = local_ca0;
            iVar5 = 0x1f;
            if ((uint)local_df0 != 0) {
              for (; (uint)local_df0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
              }
            }
            local_e08 = (char *)(((long)local_ca0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e));
            local_c50 = local_df0;
            local_bf0 = local_df0;
            if (local_d78 < local_e08) {
              local_d80 = local_ca0;
              local_d78 = local_e08;
              *local_d18 = local_ca0;
              *(undefined4 *)(local_d18 + 3) = 0;
              local_d18[1] = local_df0;
              local_d18[2] = local_d78;
            }
          }
        }
      }
    }
    if (0x7e4 < local_10b0) {
      local_10cc = 0;
      do {
        local_1090 = local_1090 + -1;
        local_10d8 = 0xaf;
        if (*(int *)(local_1030 + 4) < 5) {
          local_f80 = local_10c0 + -1;
          local_f88 = local_1090;
          local_11b0 = local_f80;
          if (local_1090 <= local_f80) {
            local_11b0 = local_1090;
          }
          local_11b8 = local_11b0;
        }
        else {
          local_11b8 = (char *)0x0;
        }
        local_10f8 = local_11b8;
        local_10e0 = 0;
        local_10f0 = (char *)0x0;
        local_10e8 = 0x7e4;
        local_f90 = local_1010 + 1;
        local_f98 = local_1040;
        local_11c0 = local_f90;
        if (local_1040 <= local_f90) {
          local_11c0 = local_1040;
        }
        local_1098 = local_11c0;
        local_fa0 = local_1010 + local_1048 + 1;
        local_fa8 = local_1040;
        local_11c8 = local_fa0;
        if (local_1040 <= local_fa0) {
          local_11c8 = local_1040;
        }
        local_10a0 = local_11c8;
        if (*(int *)(local_1030 + 0x270) != 0) {
          local_10c6 = local_10c5;
          bVar1 = *(byte *)(local_1018 + ((ulong)local_1010 & (ulong)local_1020));
          local_10c4 = (uint)*(byte *)(local_1030 + 0x275 +
                                      (long)(int)(uint)(*(byte *)(local_1028 + (ulong)bVar1) |
                                                       *(byte *)(local_1028 + 0x100 +
                                                                (ulong)local_10c5)));
          local_10c5 = bVar1;
        }
        local_7e8 = *(undefined8 *)(local_1030 + 0x2b8 + (long)(int)local_10c4 * 8);
        local_808 = local_1010 + 1;
        local_820 = local_11c8 + local_1080;
        local_828 = *(undefined8 *)(local_1030 + 0x48);
        local_7e0 = local_1038;
        local_7f0 = local_1018;
        local_7f8 = local_1020;
        local_800 = in_stack_00000010;
        local_810 = local_1090;
        local_818 = local_11c0;
        local_830 = &local_10f8;
        local_408 = local_1038;
        local_418 = local_1018;
        local_420 = local_1020;
        local_428 = in_stack_00000010;
        local_438 = local_1090;
        local_440 = local_11c0;
        local_460 = *(long *)(local_1038 + 8);
        local_468 = local_11b8;
        local_470 = (ulong)local_808 & (ulong)local_1020;
        local_474 = (uint)(byte)local_11b8[local_1018 + local_470];
        local_458 = local_830;
        local_450 = local_828;
        local_448 = local_820;
        local_430 = local_808;
        local_410 = local_7e8;
        uVar3 = duckdb_brotli::HashBytesH54((uint8_t *)(local_1018 + local_470));
        local_480 = (ulong)uVar3;
        local_490 = local_458[2];
        local_498 = local_458[2];
        local_4a0 = local_468;
        local_4a8 = (char *)(long)*local_428;
        local_4b0 = local_430 + -(long)*local_428;
        *(undefined4 *)(local_458 + 3) = 0;
        if (local_4b0 < local_430) {
          local_4b0 = (char *)((ulong)local_420 & 0xffffffff & (ulong)local_4b0);
          if (local_474 == (byte)(local_4b0 + (long)local_4a0)[local_418]) {
            local_3b8 = (ulong *)(local_4b0 + local_418);
            local_3a0 = local_3b8;
            local_3a8 = (ulong *)(local_418 + local_470);
            local_3b0 = local_438;
LAB_007bb402:
            if (local_3b0 < (char *)0x8) {
              while( true ) {
                bVar10 = false;
                if (local_3b0 != (char *)0x0) {
                  bVar10 = (char)*local_3a0 == (char)*local_3a8;
                }
                if (!bVar10) break;
                local_3b0 = local_3b0 + -1;
                local_3a8 = (ulong *)((long)local_3a8 + 1);
                local_3a0 = (ulong *)((long)local_3a0 + 1);
              }
              local_398 = (char *)((long)local_3a0 - (long)local_3b8);
            }
            else {
              local_360 = local_3a8;
              local_368 = *local_3a8;
              local_370 = local_3a0;
              local_378 = *local_3a0;
              uVar6 = *local_3a8 ^ *local_3a0;
              local_3c0 = uVar6;
              local_3a8 = local_3a8 + 1;
              if (uVar6 == 0) goto LAB_007bb4d4;
              iVar5 = 0;
              for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_3c8 = (long)iVar5;
              local_398 = (char *)((long)local_3a0 + (((ulong)(long)iVar5 >> 3) - (long)local_3b8));
            }
            local_4b8 = local_398;
            if ((char *)0x3 < local_398) {
              local_390 = local_398;
              local_4c0 = (char *)((long)local_398 * 0x87 + 0x78f);
              if (local_498 < local_4c0) {
                *local_458 = local_398;
                local_458[1] = local_4a8;
                local_458[2] = local_4c0;
                local_4a0 = local_4b8;
                local_498 = local_4c0;
                local_474 = (uint)(byte)local_4b8[local_418 + local_470];
              }
            }
          }
        }
        for (local_4f0 = 0; local_4f0 < 4; local_4f0 = local_4f0 + 1) {
          auStack_4e8[local_4f0] = local_480 + local_4f0 * 8 & 0xfffff;
        }
        local_488 = *(long *)((long)auStack_4e8 + ((ulong)local_430 & 0x18));
        for (local_4f0 = 0; local_4f0 < 4; local_4f0 = local_4f0 + 1) {
          uVar6 = (ulong)*(uint *)(local_460 + auStack_4e8[local_4f0] * 4);
          local_500 = local_430 + -uVar6;
          local_4b0 = (char *)((ulong)local_420 & 0xffffffff & uVar6);
          if ((local_474 == (byte)(local_4b0 + (long)local_4a0)[local_418]) &&
             (local_500 != (char *)0x0 && local_500 <= local_440)) {
            local_3f0 = (ulong *)(local_4b0 + local_418);
            local_3d8 = local_3f0;
            local_3e0 = (ulong *)(local_418 + local_470);
            local_3e8 = local_438;
LAB_007bb82c:
            if (local_3e8 < (char *)0x8) {
              while( true ) {
                bVar10 = false;
                if (local_3e8 != (char *)0x0) {
                  bVar10 = (char)*local_3d8 == (char)*local_3e0;
                }
                if (!bVar10) break;
                local_3e8 = local_3e8 + -1;
                local_3e0 = (ulong *)((long)local_3e0 + 1);
                local_3d8 = (ulong *)((long)local_3d8 + 1);
              }
              local_3d0 = (char *)((long)local_3d8 - (long)local_3f0);
            }
            else {
              local_340 = local_3e0;
              local_348 = *local_3e0;
              local_350 = local_3d8;
              local_358 = *local_3d8;
              uVar6 = *local_3e0 ^ *local_3d8;
              local_3f8 = uVar6;
              local_3e0 = local_3e0 + 1;
              if (uVar6 == 0) goto LAB_007bb8fe;
              iVar5 = 0;
              for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_400 = (long)iVar5;
              local_3d0 = (char *)((long)local_3d8 + (((ulong)(long)iVar5 >> 3) - (long)local_3f0));
            }
            local_4f8 = local_3d0;
            if ((char *)0x3 < local_3d0) {
              local_380 = local_3d0;
              local_388 = local_500;
              local_338 = local_500;
              iVar5 = 0x1f;
              if ((uint)local_500 != 0) {
                for (; (uint)local_500 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              local_508 = (char *)(((long)local_3d0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e));
              if (local_498 < local_508) {
                local_4a0 = local_3d0;
                *local_458 = local_3d0;
                local_474 = (uint)(byte)local_4f8[local_418 + local_470];
                local_498 = local_508;
                local_458[2] = local_508;
                local_458[1] = local_500;
              }
            }
          }
        }
        *(int *)(local_460 + local_488 * 4) = (int)local_430;
        local_198 = (uint *)(local_7e0 + 0x10);
        local_1a0 = local_7e8;
        local_1a8 = local_7f0;
        local_1b0 = local_7f8;
        local_1b8 = local_800;
        local_1c0 = local_808;
        local_1c8 = local_810;
        local_1d0 = local_818;
        local_1d8 = local_820;
        local_1e0 = local_828;
        local_1e8 = local_830;
        local_1f0 = (ulong)local_808 & (ulong)local_7f8;
        if ((((ulong)local_808 & 3) == 0) && ((char *)0x1f < local_810)) {
          for (local_1f8 = *(char **)(local_7e0 + 0x20); local_1f8 <= local_1c0;
              local_1f8 = local_1f8 + 4) {
            local_1fc = *local_198 & 0x3fffffff;
            local_1fd = *(undefined1 *)(local_1a8 + ((ulong)local_1f8 & (ulong)local_1b0));
            local_1fe = *(undefined1 *)(local_1a8 + ((ulong)(local_1f8 + 0x20) & (ulong)local_1b0));
            local_208 = 0xffffffff;
            uVar3 = duckdb_brotli::HashRollingFunctionHROLLING_FAST
                              ((uint32_t)((ulong)in_stack_ffffffffffffedb0 >> 0x20),
                               (uint8_t)((ulong)in_stack_ffffffffffffedb0 >> 0x18),
                               (uint8_t)((ulong)in_stack_ffffffffffffedb0 >> 0x10),
                               (uint32_t)((ulong)in_stack_ffffffffffffeda8 >> 0x20),
                               (uint32_t)in_stack_ffffffffffffeda8);
            *local_198 = uVar3;
            if (local_1fc < 0x1000000) {
              uVar4 = *(uint *)(*(long *)(local_198 + 2) + (ulong)local_1fc * 4);
              local_208 = (ulong)uVar4;
              *(int *)(*(long *)(local_198 + 2) + (ulong)local_1fc * 4) = (int)local_1f8;
              if ((local_1f8 == local_1c0) && (local_208 != 0xffffffff)) {
                uVar4 = (int)local_1c0 - uVar4;
                local_210 = (char *)(ulong)uVar4;
                if (local_210 <= local_1d0) {
                  local_218 = local_208 & (ulong)local_1b0;
                  local_180 = (ulong *)(local_1a8 + local_218);
                  local_170 = (ulong *)(local_1a8 + local_1f0);
                  local_178 = local_1c8;
                  local_168 = local_180;
LAB_007bbdf6:
                  if (local_178 < (char *)0x8) {
                    while( true ) {
                      bVar10 = false;
                      if (local_178 != (char *)0x0) {
                        bVar10 = (char)*local_168 == (char)*local_170;
                      }
                      if (!bVar10) break;
                      local_178 = local_178 + -1;
                      local_170 = (ulong *)((long)local_170 + 1);
                      local_168 = (ulong *)((long)local_168 + 1);
                    }
                    local_160 = (char *)((long)local_168 - (long)local_180);
                  }
                  else {
                    local_130 = local_170;
                    local_138 = *local_170;
                    local_140 = local_168;
                    local_148 = *local_168;
                    local_188 = local_138 ^ local_148;
                    local_170 = local_170 + 1;
                    if (local_188 == 0) goto LAB_007bbec8;
                    iVar5 = 0;
                    for (uVar6 = local_188; (uVar6 & 1) == 0;
                        uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                      iVar5 = iVar5 + 1;
                    }
                    local_190 = (ulong)iVar5;
                    local_160 = (char *)((long)local_168 + ((local_190 >> 3) - (long)local_180));
                  }
                  local_220 = local_160;
                  if (((char *)0x3 < local_160) && (*local_1e8 < local_160)) {
                    local_150 = local_160;
                    iVar5 = 0x1f;
                    if (uVar4 != 0) {
                      for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                      }
                    }
                    local_228 = (char *)(((long)local_160 * 0x87 + 0x780) -
                                        (ulong)(uint)(iVar5 * 0x1e));
                    local_158 = local_210;
                    local_128 = local_210;
                    if (local_1e8[2] < local_228) {
                      *local_1e8 = local_160;
                      local_1e8[1] = local_210;
                      local_1e8[2] = local_228;
                      *(undefined4 *)(local_1e8 + 3) = 0;
                    }
                  }
                }
              }
            }
          }
          *(char **)(local_198 + 4) = local_1c0 + 4;
        }
        local_f08 = (ulong *)(local_1030 + 0x58);
        local_f28 = local_1010 + 1;
        local_f40 = *(char **)(local_1030 + 0x48);
        local_f10 = local_1018;
        local_f18 = local_1020;
        local_f20 = in_stack_00000010;
        local_f30 = local_1090;
        local_f38 = local_10a0;
        local_f48 = &local_10f8;
        local_f50 = local_10a0 + *(long *)(local_1030 + 0x60);
        for (local_f58 = 0; local_f58 < *local_f08; local_f58 = local_f58 + 1) {
          local_ab8 = (int *)local_f08[local_f58 + 2];
          local_ae8 = local_f50 + -local_f08[local_f58 + 0x22];
          local_ac0 = local_f10;
          local_ac8 = local_f18;
          local_ad0 = local_f20;
          local_ad8 = local_f28;
          local_ae0 = local_f30;
          local_af0 = local_f40;
          local_af8 = local_f48;
          local_afc = local_ab8[2];
          local_b08 = local_ae8 + -(ulong)local_afc;
          local_b0c = local_ab8[3];
          local_b10 = local_ab8[4];
          local_b14 = local_ab8[5];
          local_b18 = 0x40 - local_b10;
          local_b1c = 0xffffffff >> (0x20 - (byte)local_b14 & 0x1f);
          local_b28 = 0xffffffffffffffff >> (0x40U - (char)local_b0c & 0x3f);
          local_b30 = local_ab8 + 6;
          local_b38 = local_b30 + (uint)(1 << ((byte)local_b14 & 0x1f));
          local_b40 = (long)local_b38 + (ulong)(uint)(1 << ((byte)local_b10 & 0x1f)) * 2;
          local_b50 = (ulong)local_f28 & (ulong)local_f18;
          local_b58 = local_f48[2];
          local_b60 = *local_f48;
          local_9d8 = (ulong *)(local_f10 + local_b50);
          local_9e0 = *local_9d8;
          local_b70 = (local_9e0 & local_b28) * 0x1fe35a7bd3579bd3;
          uVar6 = local_b70 >> ((byte)local_b18 & 0x3f);
          local_b74 = (uint)uVar6;
          local_b78 = local_b74 & local_b1c;
          local_b7c = (uint)*(ushort *)((long)local_b38 + (uVar6 & 0xffffffff) * 2);
          local_b88 = (uint *)(local_b40 + (ulong)(local_b30[local_b78] + local_b7c) * 4);
          local_b8c = (uint)(local_b7c == 0xffff);
          local_b98 = (undefined8 *)(local_b40 + (ulong)(uint)local_ab8[1] * 4);
          local_b48 = local_b98;
          if (*local_ab8 != -0x21431220) {
            local_b48 = (undefined8 *)*local_b98;
            local_9c8 = local_b48;
            local_9c0 = local_b98;
          }
          for (local_b68 = 0; local_b68 < 4; local_b68 = local_b68 + 1) {
            local_ba0 = (char *)(long)local_ad0[local_b68];
            if ((local_b08 < local_ba0) && (local_ba0 <= local_ae8)) {
              local_ba8 = (long)local_ae8 - (long)local_ba0;
              local_11d8 = (char *)((ulong)local_afc - local_ba8);
              if (local_ae0 < local_11d8) {
                local_11d8 = local_ae0;
              }
              local_bb0 = local_11d8;
              local_a68 = (ulong *)((long)local_b48 + local_ba8);
              local_a58 = (ulong *)(local_ac0 + local_b50);
              local_a60 = local_11d8;
              local_a50 = local_a68;
LAB_007bc64c:
              if (local_a60 < (char *)0x8) {
                while( true ) {
                  bVar10 = false;
                  if (local_a60 != (char *)0x0) {
                    bVar10 = (char)*local_a50 == (char)*local_a58;
                  }
                  if (!bVar10) break;
                  local_a60 = local_a60 + -1;
                  local_a58 = (ulong *)((long)local_a58 + 1);
                  local_a50 = (ulong *)((long)local_a50 + 1);
                }
                local_a48 = (char *)((long)local_a50 - (long)local_a68);
              }
              else {
                local_a08 = local_a58;
                local_a10 = *local_a58;
                local_a18 = local_a50;
                local_a20 = *local_a50;
                local_a70 = local_a10 ^ local_a20;
                local_a58 = local_a58 + 1;
                if (local_a70 == 0) goto LAB_007bc71e;
                iVar5 = 0;
                for (uVar6 = local_a70; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_a78 = (ulong)iVar5;
                local_a48 = (char *)((long)local_a50 + ((local_a78 >> 3) - (long)local_a68));
              }
              local_bb8 = local_a48;
              if ((char *)0x1 < local_a48) {
                local_a40 = local_a48;
                local_bc0 = (char *)((long)local_a48 * 0x87 + 0x78f);
                if (local_b58 < local_bc0) {
                  if (local_b68 != 0) {
                    local_a38 = local_b68;
                    local_bc0 = local_bc0 +
                                -((long)(int)(0x1ca10 >> ((byte)local_b68 & 0xe) & 0xe) + 0x27);
                  }
                  if (local_b58 < local_bc0) {
                    local_b58 = local_bc0;
                    if (local_b60 < local_a48) {
                      local_b60 = local_a48;
                    }
                    *local_af8 = local_a48;
                    *(undefined4 *)(local_af8 + 3) = 0;
                    local_af8[1] = local_ba0;
                    local_af8[2] = local_b58;
                  }
                }
              }
            }
          }
          while (local_b8c == 0) {
            local_b8c = *local_b88;
            local_b88 = local_b88 + 1;
            local_bc8 = (ulong)(local_b8c & 0x7fffffff);
            local_b8c = local_b8c & 0x80000000;
            local_bd0 = local_ae8 + -local_bc8;
            local_11e8 = (char *)(local_afc - local_bc8);
            if (local_ae0 < local_11e8) {
              local_11e8 = local_ae0;
            }
            local_bd8 = local_11e8;
            if ((((local_bd0 <= local_af0) && (local_b60 + local_b50 <= local_ac8)) &&
                (local_b60 < local_11e8)) &&
               (local_b60[local_ac0 + local_b50] ==
                *(char *)((long)local_b48 + (long)(local_b60 + local_bc8)))) {
              local_aa0 = (ulong *)((long)local_b48 + local_bc8);
              local_a90 = (ulong *)(local_ac0 + local_b50);
              local_a98 = local_11e8;
              local_a88 = local_aa0;
LAB_007bcaee:
              if (local_a98 < (char *)0x8) {
                while( true ) {
                  bVar10 = false;
                  if (local_a98 != (char *)0x0) {
                    bVar10 = (char)*local_a88 == (char)*local_a90;
                  }
                  if (!bVar10) break;
                  local_a98 = local_a98 + -1;
                  local_a90 = (ulong *)((long)local_a90 + 1);
                  local_a88 = (ulong *)((long)local_a88 + 1);
                }
                local_a80 = (char *)((long)local_a88 - (long)local_aa0);
              }
              else {
                local_9e8 = local_a90;
                local_9f0 = *local_a90;
                local_9f8 = local_a88;
                local_a00 = *local_a88;
                local_aa8 = local_9f0 ^ local_a00;
                local_a90 = local_a90 + 1;
                if (local_aa8 == 0) goto LAB_007bcbc0;
                iVar5 = 0;
                for (uVar6 = local_aa8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_ab0 = (ulong)iVar5;
                local_a80 = (char *)((long)local_a88 + ((local_ab0 >> 3) - (long)local_aa0));
              }
              local_be0 = local_a80;
              if ((char *)0x3 < local_a80) {
                local_a28 = local_a80;
                iVar5 = 0x1f;
                if ((uint)local_bd0 != 0) {
                  for (; (uint)local_bd0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                local_be8 = (char *)(((long)local_a80 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e))
                ;
                local_a30 = local_bd0;
                local_9d0 = local_bd0;
                if (local_b58 < local_be8) {
                  local_b60 = local_a80;
                  local_b58 = local_be8;
                  *local_af8 = local_a80;
                  *(undefined4 *)(local_af8 + 3) = 0;
                  local_af8[1] = local_bd0;
                  local_af8[2] = local_b58;
                }
              }
            }
          }
        }
        pcVar7 = local_1010;
        if (local_10e8 < local_10b0 + 0xaf) break;
        pcVar7 = local_1010 + 1;
        local_1058 = local_1058 + 1;
        local_10c0 = local_10f8;
        local_10b8 = local_10f0;
        local_10b0 = local_10e8;
        local_10a8 = CONCAT44(uStack_10dc,local_10e0);
        local_10cc = local_10cc + 1;
        if (3 < local_10cc) break;
        local_848 = 8;
        local_850 = 4;
        pcVar8 = local_1010 + 9;
        local_1010 = pcVar7;
      } while (pcVar8 < local_1060);
      local_1010 = pcVar7;
      local_1078 = local_1010 + local_1070 + (long)local_10c0 * 2;
      local_fb0 = local_1010 + local_1048;
      local_fb8 = local_1040;
      local_1208 = local_fb0;
      if (local_1040 <= local_fb0) {
        local_1208 = local_1040;
      }
      local_10a0 = local_1208;
      local_e88 = local_1208 + local_1080;
      local_e80 = local_10b8;
      if (local_e88 < local_10b8) {
LAB_007bd0f3:
        local_e78 = local_10b8 + 0xf;
      }
      else {
        local_e98 = local_10b8 + 3;
        local_ea0 = (long)local_e98 - (long)*in_stack_00000010;
        local_ea8 = (long)local_e98 - (long)in_stack_00000010[1];
        if (local_10b8 == (char *)(long)*in_stack_00000010) {
          local_e78 = (char *)0x0;
        }
        else if (local_10b8 == (char *)(long)in_stack_00000010[1]) {
          local_e78 = (char *)0x1;
        }
        else if (local_ea0 < 7) {
          local_e78 = (char *)(long)(int)(0x9750468 >>
                                          ((byte)((local_ea0 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (local_ea8 < 7) {
          local_e78 = (char *)(long)(int)(0xfdb1ace >>
                                          ((byte)((local_ea8 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (local_10b8 == (char *)(long)in_stack_00000010[2]) {
          local_e78 = (char *)0x2;
        }
        else {
          if (local_10b8 != (char *)(long)in_stack_00000010[3]) goto LAB_007bd0f3;
          local_e78 = (char *)0x3;
        }
      }
      if ((local_10b8 <= local_1208 + local_1080) && (local_e78 != (char *)0x0)) {
        in_stack_00000010[3] = in_stack_00000010[2];
        in_stack_00000010[2] = in_stack_00000010[1];
        in_stack_00000010[1] = *in_stack_00000010;
        *in_stack_00000010 = (int)local_10b8;
        local_868 = local_1038;
        local_700 = local_1038;
        local_6e0 = local_1038 + 0x10;
      }
      local_e48 = (uint *)(local_1030 + 0x38);
      local_e40 = in_stack_00000020;
      local_e50 = local_1058;
      local_e58 = local_10c0;
      local_e5c = (uint)local_10a8;
      local_e68 = local_e78;
      local_e6c = (uint)local_10a8 & 0xff;
      *in_stack_00000020 = (int)local_1058;
      in_stack_00000020[1] = (uint)local_10c0 | local_e6c << 0x19;
      local_958 = (ulong)*(uint *)(local_1030 + 0x3c);
      local_960 = (ulong)*local_e48;
      local_968 = (ushort *)((long)in_stack_00000020 + 0xe);
      local_970 = in_stack_00000020 + 2;
      local_950 = local_e78;
      if (local_e78 < (char *)(local_958 + 0x10)) {
        *local_968 = (ushort)local_e78;
        *local_970 = 0;
      }
      else {
        bVar1 = (byte)*local_e48;
        local_978 = local_e78 + (1L << (bVar1 + 2 & 0x3f)) + (-0x10 - local_958);
        iVar5 = 0x1f;
        if ((uint)local_978 != 0) {
          for (; (uint)local_978 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_980 = (ulong)(iVar5 - 1U);
        local_988 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
        local_990 = (ulong)local_978 & local_988;
        bVar9 = (byte)(iVar5 - 1U);
        local_998 = (ulong)local_978 >> (bVar9 & 0x3f) & 1;
        local_9a0 = local_998 + 2 << (bVar9 & 0x3f);
        local_9a8 = local_980 - local_960;
        *local_968 = (short)local_9a8 * 0x400 |
                     (short)*(uint *)(local_1030 + 0x3c) + 0x10 +
                     (short)((local_9a8 + -1) * 2 + local_998 << (bVar1 & 0x3f)) + (short)local_990;
        *local_970 = (int)((ulong)((long)local_978 - local_9a0) >> (bVar1 & 0x3f));
        local_948 = local_978;
      }
      iVar5 = (uint)local_10c0 + (uint)local_10a8;
      local_928 = (ulong)iVar5;
      local_92c = (uint)((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0);
      local_938 = (ushort *)(in_stack_00000020 + 3);
      local_920 = local_1058;
      local_910 = local_1058;
      if (local_1058 < 6) {
        local_902 = (ushort)local_1058;
      }
      else if (local_1058 < 0x82) {
        local_8f8 = local_1058 - 2;
        local_914 = 0x1f;
        if ((uint)local_8f8 != 0) {
          for (; (uint)local_8f8 >> local_914 == 0; local_914 = local_914 + -1) {
          }
        }
        local_914 = local_914 + -1;
        local_902 = (short)local_914 * 2 + (short)(local_1058 - 2 >> ((byte)local_914 & 0x3f)) + 2;
      }
      else if (local_1058 < 0x842) {
        local_900 = local_1058 - 0x42;
        iVar2 = 0x1f;
        if ((uint)local_900 != 0) {
          for (; (uint)local_900 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        local_902 = (short)iVar2 + 10;
      }
      else if (local_1058 < 0x1842) {
        local_902 = 0x15;
      }
      else if (local_1058 < 0x5842) {
        local_902 = 0x16;
      }
      else {
        local_902 = 0x17;
      }
      local_93a = local_902;
      if (local_928 < 10) {
        local_8da = (short)iVar5 - 2;
      }
      else if (local_928 < 0x86) {
        local_8d0 = local_928 - 6;
        local_8ec = 0x1f;
        if ((uint)local_8d0 != 0) {
          for (; (uint)local_8d0 >> local_8ec == 0; local_8ec = local_8ec + -1) {
          }
        }
        local_8ec = local_8ec + -1;
        local_8da = (short)local_8ec * 2 + (short)(local_928 - 6 >> ((byte)local_8ec & 0x3f)) + 4;
      }
      else if (local_928 < 0x846) {
        local_8d8 = local_928 - 0x46;
        iVar5 = 0x1f;
        if ((uint)local_8d8 != 0) {
          for (; (uint)local_8d8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_8da = (short)iVar5 + 0xc;
      }
      else {
        local_8da = 0x17;
      }
      local_93c = local_8da;
      local_8b4 = local_902;
      local_8b6 = local_8da;
      local_8be = local_8da & 7 | (local_902 & 7) << 3;
      if (((local_92c == 0) || (7 < local_902)) || (0xf < local_8da)) {
        iVar5 = ((int)(uint)local_8da >> 3) + ((int)(uint)local_902 >> 3) * 3;
        local_8c4 = iVar5 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar5 * '\x02' & 0x1fU) & 0xc0);
        local_8b2 = (ushort)local_8c4 | local_8be;
      }
      else {
        local_8b2 = local_8be;
        if (7 < local_8da) {
          local_8b2 = local_8be | 0x40;
        }
      }
      *local_938 = local_8b2;
      *in_stack_00000030 = local_1058 + *in_stack_00000030;
      local_1058 = 0;
      pcVar7 = local_1010 + 2;
      local_fc0 = local_1010 + (long)local_10c0;
      local_fc8 = local_1068;
      local_1220 = local_fc0;
      if (local_1068 <= local_fc0) {
        local_1220 = local_1068;
      }
      local_1108 = pcVar7;
      if (local_10b8 < (char *)((ulong)local_10c0 >> 2)) {
        local_e18 = local_1010 + (long)local_10c0 + (long)local_10b8 * -4;
        local_1230 = local_e18;
        if (local_e18 < pcVar7) {
          local_1230 = pcVar7;
        }
        local_fd0 = local_1220;
        local_fd8 = local_1230;
        if (local_1220 < local_1230) {
          local_1238 = local_1220;
        }
        else {
          local_1238 = local_1230;
        }
        local_1108 = local_1238;
        local_e10 = pcVar7;
      }
      local_760 = local_1038;
      local_768 = local_1018;
      local_770 = local_1020;
      local_778 = local_1108;
      local_780 = local_1220;
      local_f8 = local_1038;
      local_100 = local_1018;
      local_108 = local_1020;
      local_110 = local_1108;
      local_118 = local_1220;
      local_8e8 = local_928;
      local_8bc = local_92c;
      for (local_120 = local_1108; local_120 < local_118; local_120 = local_120 + 1) {
        local_a8 = local_f8;
        local_b0 = local_100;
        local_b8 = local_108;
        local_c0 = local_120;
        local_c4 = duckdb_brotli::HashBytesH54
                             ((uint8_t *)(local_100 + ((ulong)local_120 & (ulong)local_108)));
        local_c8 = (uint)local_c0 & 0x18;
        *(uint *)(*(long *)(local_a8 + 8) + (ulong)(local_c4 + local_c8 & 0xfffff) * 4) =
             (uint)local_c0;
      }
      local_d0 = local_760 + 0x10;
      local_d8 = local_768;
      local_e0 = local_770;
      local_e8 = local_778;
      local_f0 = local_780;
      in_stack_00000020 = in_stack_00000020 + 4;
      pcVar7 = local_10c0 + (long)local_1010;
      goto LAB_007b8f29;
    }
    local_1058 = local_1058 + 1;
    pcVar7 = local_1010 + 1;
    if (local_1078 < pcVar7) {
      if (local_1078 + local_1070 * 4 < pcVar7) {
        local_898 = 8;
        local_8a0 = 4;
        local_e20 = 7;
        local_e28 = 4;
        local_fe0 = local_1010 + 0x11;
        local_fe8 = local_1060 + -7;
        in_stack_ffffffffffffedb0 = local_fe8;
        local_1010 = pcVar7;
        pcVar8 = local_fe8;
        if (local_fe0 < local_fe8) {
          in_stack_ffffffffffffedb0 = local_fe0;
          pcVar8 = local_fe0;
        }
        for (; pcVar7 = local_1010, local_1010 < pcVar8; local_1010 = local_1010 + 4) {
          local_720 = local_1038;
          local_728 = local_1018;
          local_730 = local_1020;
          local_738 = local_1010;
          local_80 = local_1038;
          local_88 = local_1018;
          local_90 = local_1020;
          local_98 = local_1010;
          local_9c = duckdb_brotli::HashBytesH54
                               ((uint8_t *)(local_1018 + ((ulong)local_1010 & (ulong)local_1020)));
          local_a0 = (uint)local_98 & 0x18;
          *(uint *)(*(long *)(local_80 + 8) + (ulong)(local_9c + local_a0 & 0xfffff) * 4) =
               (uint)local_98;
          local_38 = local_720 + 0x10;
          local_40 = local_728;
          local_48 = local_730;
          local_50 = local_738;
          local_1058 = local_1058 + 4;
        }
      }
      else {
        local_8a8 = 8;
        local_8b0 = 4;
        in_stack_ffffffffffffeda8 = 8;
        local_e30 = 7;
        local_e38 = 2;
        local_ff0 = local_1010 + 9;
        local_ff8 = local_1060 + -7;
        local_1010 = pcVar7;
        local_1268 = local_ff8;
        if (local_ff0 < local_ff8) {
          local_1268 = local_ff0;
        }
        for (; pcVar7 = local_1010, local_1010 < local_1268; local_1010 = local_1010 + 2) {
          local_740 = local_1038;
          local_748 = local_1018;
          local_750 = local_1020;
          local_758 = local_1010;
          local_58 = local_1038;
          local_60 = local_1018;
          local_68 = local_1020;
          local_70 = local_1010;
          local_74 = duckdb_brotli::HashBytesH54
                               ((uint8_t *)(local_1018 + ((ulong)local_1010 & (ulong)local_1020)));
          local_78 = (uint)local_70 & 0x18;
          *(uint *)(*(long *)(local_58 + 8) + (ulong)(local_74 + local_78 & 0xfffff) * 4) =
               (uint)local_70;
          local_18 = local_740 + 0x10;
          local_20 = local_748;
          local_28 = local_750;
          local_30 = local_758;
          local_1058 = local_1058 + 2;
        }
      }
    }
  } while( true );
  local_578 = local_578 + 1;
  local_588 = local_588 + -8;
  goto LAB_007b94e9;
LAB_007b99e5:
  local_5b0 = local_5b0 + 1;
  local_5c0 = local_5c0 + -8;
  goto LAB_007b9913;
LAB_007b9faf:
  local_270 = local_270 + 1;
  local_280 = local_280 + -8;
  goto LAB_007b9edd;
LAB_007ba801:
  local_c70 = local_c70 + 1;
  local_c80 = local_c80 + -8;
  goto LAB_007ba72f;
LAB_007baca3:
  local_ca8 = local_ca8 + 1;
  local_cb8 = local_cb8 + -8;
  goto LAB_007babd1;
LAB_007bb4d4:
  local_3a0 = local_3a0 + 1;
  local_3b0 = local_3b0 + -8;
  goto LAB_007bb402;
LAB_007bb8fe:
  local_3d8 = local_3d8 + 1;
  local_3e8 = local_3e8 + -8;
  goto LAB_007bb82c;
LAB_007bbec8:
  local_168 = local_168 + 1;
  local_178 = local_178 + -8;
  goto LAB_007bbdf6;
LAB_007bc71e:
  local_a50 = local_a50 + 1;
  local_a60 = local_a60 + -8;
  goto LAB_007bc64c;
LAB_007bcbc0:
  local_a88 = local_a88 + 1;
  local_a98 = local_a98 + -8;
  goto LAB_007bcaee;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}